

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

StringRef * __thiscall
Catch::Capturer::Capturer::anon_class_8_1_a855c668::operator()
          (StringRef *__return_storage_ptr__,anon_class_8_1_a855c668 *this,size_t start,size_t end)

{
  StringRef *pSVar1;
  int iVar2;
  char *pcVar3;
  size_type sVar4;
  char *pcVar5;
  
  pSVar1 = this->names;
  pcVar5 = pSVar1->m_start;
  do {
    if (pcVar5[start] != 0x2c) {
      iVar2 = isspace((int)pcVar5[start]);
      if (iVar2 == 0) {
        pcVar3 = pcVar5 + start;
        pcVar5 = pcVar5 + end;
        sVar4 = (end + 1) - start;
        do {
          if (*pcVar5 != 0x2c) {
            iVar2 = isspace((int)*pcVar5);
            if (iVar2 == 0) {
              if (start < pSVar1->m_size) {
                __return_storage_ptr__->m_size = sVar4;
                __return_storage_ptr__->m_data = (char *)0x0;
              }
              else {
                __return_storage_ptr__->m_size = 0;
                __return_storage_ptr__->m_data = (char *)0x0;
                pcVar3 = "";
              }
              __return_storage_ptr__->m_start = pcVar3;
              return __return_storage_ptr__;
            }
          }
          sVar4 = sVar4 - 1;
          pcVar5 = pcVar5 + -1;
        } while( true );
      }
    }
    start = start + 1;
  } while( true );
}

Assistant:

Capturer::Capturer( StringRef macroName, SourceLineInfo const& lineInfo, ResultWas::OfType resultType, StringRef names ) {
        auto trimmed = [&] (size_t start, size_t end) {
            while (names[start] == ',' || isspace(names[start])) {
                ++start;
            }
            while (names[end] == ',' || isspace(names[end])) {
                --end;
            }
            return names.substr(start, end - start + 1);
        };

        size_t start = 0;
        std::stack<char> openings;
        for (size_t pos = 0; pos < names.size(); ++pos) {
            char c = names[pos];
            switch (c) {
            case '[':
            case '{':
            case '(':
            // It is basically impossible to disambiguate between
            // comparison and start of template args in this context
//            case '<':
                openings.push(c);
                break;
            case ']':
            case '}':
            case ')':
//           case '>':
                openings.pop();
                break;
            case ',':
                if (start != pos && openings.size() == 0) {
                    m_messages.emplace_back(macroName, lineInfo, resultType);
                    m_messages.back().message = trimmed(start, pos);
                    m_messages.back().message += " := ";
                    start = pos;
                }
            }
        }
        assert(openings.size() == 0 && "Mismatched openings");
        m_messages.emplace_back(macroName, lineInfo, resultType);
        m_messages.back().message = trimmed(start, names.size() - 1);
        m_messages.back().message += " := ";
    }